

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3ExtensionHandler::initExtensionsNew(COpenGL3ExtensionHandler *this)

{
  GLint GVar1;
  int k;
  int ext_count;
  COpenGL3ExtensionHandler *in_stack_000000e0;
  string *in_stack_ffffffffffffffc8;
  COpenGL3ExtensionHandler *in_stack_ffffffffffffffd0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  GLuint GVar2;
  
  GVar1 = GetInteger(0);
  for (GVar2 = 0; (int)GVar2 < GVar1; GVar2 = GVar2 + 1) {
    (*GL.GetStringi)(0x1f03,GVar2);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(GVar1,GVar2),in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    addExtension(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  extensionsLoaded(in_stack_000000e0);
  return;
}

Assistant:

void COpenGL3ExtensionHandler::initExtensionsNew()
{
	int ext_count = GetInteger(GL_NUM_EXTENSIONS);
	for (int k = 0; k < ext_count; k++)
		addExtension(reinterpret_cast<const char *>(GL.GetStringi(GL_EXTENSIONS, k)));
	extensionsLoaded();
}